

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaces.cpp
# Opt level: O2

optional<Coin> * __thiscall
node::anon_unknown_2::NodeImpl::getUnspentOutput
          (optional<Coin> *__return_storage_ptr__,NodeImpl *this,COutPoint *output)

{
  int iVar1;
  ChainstateManager *this_00;
  Chainstate *this_01;
  CCoinsViewCache *pCVar2;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock25;
  Coin coin;
  unique_lock<std::recursive_mutex> local_60;
  Coin local_50;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)&local_60,&cs_main,"::cs_main",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/interfaces.cpp"
             ,0x161,false);
  Coin::Coin(&local_50);
  this_00 = chainman(this);
  this_01 = ChainstateManager::ActiveChainstate(this_00);
  pCVar2 = Chainstate::CoinsTip(this_01);
  iVar1 = (**(pCVar2->super_CCoinsViewBacked).super_CCoinsView._vptr_CCoinsView)
                    (pCVar2,output,&local_50);
  if ((char)iVar1 == '\0') {
    (__return_storage_ptr__->super__Optional_base<Coin,_false,_false>)._M_payload.
    super__Optional_payload<Coin,_true,_false,_false>.super__Optional_payload_base<Coin>._M_engaged
         = false;
  }
  else {
    std::optional<Coin>::optional<Coin,_true>(__return_storage_ptr__,&local_50);
  }
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            (&local_50.out.scriptPubKey.super_CScriptBase);
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_60);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::optional<Coin> getUnspentOutput(const COutPoint& output) override
    {
        LOCK(::cs_main);
        Coin coin;
        if (chainman().ActiveChainstate().CoinsTip().GetCoin(output, coin)) return coin;
        return {};
    }